

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::SignWithSchnorrPrivkeySimple
          (TransactionContext *this,OutPoint *outpoint,Privkey *privkey,SigHashType *sighash_type,
          ByteData256 *aux_rand,ByteData *annex)

{
  SigHashType *in_RCX;
  Privkey *in_RDX;
  ByteData256 *in_R8;
  SchnorrSignature signature;
  ByteData256 sighash;
  uint32_t *in_stack_00000608;
  ByteData256 *in_stack_00000610;
  SigHashType *in_stack_00000618;
  OutPoint *in_stack_00000620;
  TransactionContext *in_stack_00000628;
  ByteData *in_stack_00000640;
  SchnorrSignature local_d0;
  SchnorrSignature local_a8;
  SchnorrSignature local_70;
  ByteData256 local_48;
  ByteData256 *local_28;
  SigHashType *local_20;
  Privkey *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  CreateSignatureHashByTaproot
            (in_stack_00000628,in_stack_00000620,in_stack_00000618,in_stack_00000610,
             in_stack_00000608,in_stack_00000640);
  core::SchnorrSignature::SchnorrSignature(&local_70);
  if (local_28 == (ByteData256 *)0x0) {
    core::SchnorrUtil::Sign(&local_d0,&local_48,local_18);
    core::SchnorrSignature::operator=(&local_70,&local_d0);
    core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x53b0d0);
  }
  else {
    core::SchnorrUtil::Sign(&local_a8,&local_48,local_18,local_28);
    core::SchnorrSignature::operator=(&local_70,&local_a8);
    core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x53b051);
  }
  core::SchnorrSignature::SetSigHashType(&local_70,local_20);
  AddSchnorrSign((TransactionContext *)signature.sighash_type_._0_8_,
                 (OutPoint *)
                 signature.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (SchnorrSignature *)
                 signature.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (ByteData *)
                 signature.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x53b12b);
  core::ByteData256::~ByteData256((ByteData256 *)0x53b138);
  return;
}

Assistant:

void TransactionContext::SignWithSchnorrPrivkeySimple(
    const OutPoint& outpoint, const Privkey& privkey,
    const SigHashType& sighash_type, const ByteData256* aux_rand,
    const ByteData* annex) {
  auto sighash =
      CreateSignatureHashByTaproot(outpoint, sighash_type, nullptr, 0, annex);
  SchnorrSignature signature;
  if (aux_rand != nullptr) {
    signature = SchnorrUtil::Sign(sighash, privkey, *aux_rand);
  } else {
    signature = SchnorrUtil::Sign(sighash, privkey);
  }
  signature.SetSigHashType(sighash_type);
  AddSchnorrSign(outpoint, signature, annex);
}